

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingTesselationControlShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_tesselation_control_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  bool *pbVar2;
  attributeDefinition *paVar3;
  ostream *poVar4;
  GLuint GVar5;
  GLuint n_components;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  undefined *puVar9;
  undefined8 *puVar10;
  bool bVar11;
  bool *local_218;
  char *local_210;
  string sampling_code;
  string local_1d8 [32];
  stringstream stream;
  ostream local_1a8;
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  sampling_function_00 = *sampling_function;
  uVar6 = (ulong)sampling_function_00;
  lVar8 = 0;
  puVar9 = (undefined *)0x0;
  if (uVar6 < 4) {
    lVar8 = *(long *)(&DAT_017ccf00 + uVar6 * 8);
    puVar9 = (&PTR_texture_attributes_01e04838)[uVar6];
  }
  sVar1 = *sampler_type;
  paVar3 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    paVar3 = (attributeDefinition *)0x0;
  }
  local_210 = (GLchar *)0x0;
  local_218 = (bool *)0x0;
  pbVar2 = local_218;
  local_218 = (bool *)0x178b2d1;
  GVar5 = 4;
  pcVar7 = (char *)0x0;
  n_components = 0;
  switch(sVar1) {
  case Float:
    pcVar7 = "samplerCubeArray ";
    local_218 = fixed_sample_locations_values + 1;
    local_210 = "vec4 ";
    n_components = GVar5;
    pbVar2 = local_218;
    break;
  case Int:
    pcVar7 = "isamplerCubeArray ";
    local_210 = "ivec4 ";
    n_components = GVar5;
    pbVar2 = local_218;
    break;
  case UInt:
    local_210 = "uvec4 ";
    pcVar7 = "usamplerCubeArray ";
    n_components = GVar5;
    pbVar2 = local_218;
    break;
  case Depth:
    local_210 = "float ";
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x16b4a87,sampling_function_00,"float ",1,
               "vs_out_","gl_InvocationID","tes_in_color","gl_InvocationID","sampler",&sampling_code
              );
    local_218 = fixed_sample_locations_values + 1;
    pcVar7 = "samplerCubeArrayShadow ";
    goto LAB_00d44ae5;
  case Stencil:
    local_210 = "uint ";
    pcVar7 = "usamplerCubeArray ";
    n_components = 1;
    pbVar2 = local_218;
  }
  local_218 = pbVar2;
  getSamplingFunctionCall
            ((TextureCubeMapArraySamplingTest *)0x16b4a87,sampling_function_00,local_210,
             n_components,"vs_out_","gl_InvocationID","tes_in_color","gl_InvocationID","sampler",
             &sampling_code);
LAB_00d44ae5:
  poVar4 = std::operator<<(&local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n");
  poVar4 = std::operator<<(poVar4,"${TESSELLATION_SHADER_REQUIRE}\n");
  poVar4 = std::operator<<(poVar4,"precision highp float;\n");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"/* Sampling tesselation control shader */");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<(&local_1a8,"layout(vertices = 1) out;\n\n");
  poVar4 = std::operator<<(&local_1a8,"uniform ");
  poVar4 = std::operator<<(poVar4,"highp ");
  poVar4 = std::operator<<(poVar4,pcVar7);
  poVar4 = std::operator<<(poVar4,"sampler");
  poVar4 = std::operator<<(poVar4,";");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(&local_1a8);
  puVar10 = (undefined8 *)(puVar9 + 8);
  while (bVar11 = lVar8 != 0, lVar8 = lVar8 + -1, bVar11) {
    poVar4 = std::operator<<(&local_1a8,"in ");
    poVar4 = std::operator<<(poVar4,(char *)*puVar10);
    poVar4 = std::operator<<(poVar4,"vs_out_");
    poVar4 = std::operator<<(poVar4,(char *)puVar10[-1]);
    poVar4 = std::operator<<(poVar4,"[];");
    std::endl<char,std::char_traits<char>>(poVar4);
    puVar10 = puVar10 + 3;
  }
  if (sVar1 == Depth) {
    bVar11 = true;
    lVar8 = 0;
    while (bVar11) {
      poVar4 = std::operator<<(&local_1a8,"in ");
      poVar4 = std::operator<<(poVar4,paVar3[lVar8].type);
      poVar4 = std::operator<<(poVar4,"vs_out_");
      poVar4 = std::operator<<(poVar4,paVar3[lVar8].name);
      poVar4 = std::operator<<(poVar4,"[];");
      bVar11 = false;
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar8 = 1;
    }
  }
  std::endl<char,std::char_traits<char>>(&local_1a8);
  poVar4 = std::operator<<(&local_1a8,local_218);
  poVar4 = std::operator<<(poVar4,"out ");
  poVar4 = std::operator<<(poVar4,local_210);
  poVar4 = std::operator<<(poVar4,"tes_in_color");
  poVar4 = std::operator<<(poVar4,"[];");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(&local_1a8);
  std::operator<<(&local_1a8,
                  "void main()\n{\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                 );
  std::operator<<(&local_1a8,(string *)&sampling_code);
  poVar4 = std::operator<<(&local_1a8,"}");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_tesselation_control_shader_code,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::__cxx11::string::~string((string *)&sampling_code);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingTesselationControlShaderCode(
	const samplerType& sampler_type, const samplingFunction& sampling_function,
	std::string& out_tesselation_control_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_output, "gl_InvocationID",
								tesselation_evaluation_shader_input, "gl_InvocationID", sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_output,
									  "gl_InvocationID", tesselation_evaluation_shader_input, "gl_InvocationID",
									  sampler_name, sampling_code);
	}

	/* Preamble, extension : require  */
	stream << shader_code_preamble << tesselation_shader_extension << shader_precision << std::endl
		   << "/* Sampling tesselation control shader */" << std::endl;

	/* layout(vertices = 1) out */
	stream << tesselation_control_shader_layout;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	stream << std::endl;

	/* in type attribute[]*/
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << shader_input << routine_attribute_definitions[i].type << vertex_shader_output
			   << routine_attribute_definitions[i].name << "[];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << shader_input << type_attribute_definitions[i].type << vertex_shader_output
			   << type_attribute_definitions[i].name << "[];" << std::endl;
	}

	stream << std::endl;

	/* out vec4 tes_in_color */
	stream << interpolation_type << shader_output << color_type << tesselation_evaluation_shader_input << "[];"
		   << std::endl;

	stream << std::endl;

	/* Body */
	stream << tesselation_control_shader_sampling_body_code;

	/* Sampling code */
	stream << sampling_code;

	stream << "}" << std::endl << std::endl;

	/* Store result */
	out_tesselation_control_shader_code = stream.str();
}